

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void learn(lda *l,single_learner *param_2,example *ec)

{
  int *piVar1;
  byte bVar2;
  byte *pbVar3;
  float *pfVar4;
  byte *pbVar5;
  float *pfVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  int iVar9;
  index_feature temp;
  example *local_48;
  float local_40;
  unsigned_long local_38;
  
  uVar8 = (long)(l->examples)._end - (long)(l->examples)._begin >> 3;
  local_48 = ec;
  v_array<example_*>::push_back(&l->examples,&local_48);
  local_48 = (example *)((ulong)local_48 & 0xffffffff00000000);
  v_array<int>::push_back(&l->doc_lengths,(int *)&local_48);
  pbVar3 = (ec->super_example_predict).indices._end;
  for (pbVar5 = (ec->super_example_predict).indices._begin; iVar9 = (int)uVar8, pbVar5 != pbVar3;
      pbVar5 = pbVar5 + 1) {
    bVar2 = *pbVar5;
    pfVar4 = (ec->super_example_predict).feature_space[bVar2].values._end;
    puVar7 = (ec->super_example_predict).feature_space[bVar2].indicies._begin;
    for (pfVar6 = (ec->super_example_predict).feature_space[bVar2].values._begin; pfVar6 != pfVar4;
        pfVar6 = pfVar6 + 1) {
      local_48 = (example *)CONCAT44(local_48._4_4_,iVar9);
      local_40 = *pfVar6;
      local_38 = *puVar7;
      std::vector<index_feature,_std::allocator<index_feature>_>::push_back
                (&l->sorted_features,(value_type *)&local_48);
      piVar1 = (l->doc_lengths)._begin + (uVar8 & 0xffffffff);
      *piVar1 = *piVar1 + (int)*pfVar6;
      puVar7 = puVar7 + 1;
    }
  }
  if ((ulong)(iVar9 + 1) == l->minibatch) {
    learn_batch(l);
  }
  return;
}

Assistant:

void learn(lda &l, LEARNER::single_learner &, example &ec)
{
  uint32_t num_ex = (uint32_t)l.examples.size();
  l.examples.push_back(&ec);
  l.doc_lengths.push_back(0);
  for (features &fs : ec)
  {
    for (features::iterator &f : fs)
    {
      index_feature temp = {num_ex, feature(f.value(), f.index())};
      l.sorted_features.push_back(temp);
      l.doc_lengths[num_ex] += (int)f.value();
    }
  }
  if (++num_ex == l.minibatch)
    learn_batch(l);
}